

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

void __thiscall CLI::App::_parse_stream(App *this,istream *input)

{
  element_type *peVar1;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  
  peVar1 = (this->config_formatter_).super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (*peVar1->_vptr_Config[1])(&values,peVar1,input);
  _parse_config(this,&values);
  increment_parsed(this);
  _trigger_pre_parse(this,((long)values.
                                 super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)values.
                                super__Vector_base<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>
                                ._M_impl.super__Vector_impl_data._M_start) / 0x50);
  _process(this);
  _process_extras(this);
  std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector(&values);
  return;
}

Assistant:

CLI11_INLINE void App::_parse_stream(std::istream &input) {
    auto values = config_formatter_->from_config(input);
    _parse_config(values);
    increment_parsed();
    _trigger_pre_parse(values.size());
    _process();

    // Throw error if any items are left over (depending on settings)
    _process_extras();
}